

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

bool crnlib::etc1_block::unpack_color5
               (color_quad_u8 *result,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  uint alpha_00;
  byte in_CL;
  ushort in_SI;
  color_quad<unsigned_char,_int> *in_RDI;
  uint in_R8D;
  bool success;
  int r;
  int g;
  int b;
  color_quad_i16 dc;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  
  unpack_delta3((uint16)((uint)in_stack_ffffffffffffffcc >> 0x10));
  local_20 = (in_SI & 0x1f) + (int)local_18;
  local_24 = ((int)(uint)in_SI >> 5 & 0x1fU) + (int)local_1a;
  local_28 = ((int)(uint)in_SI >> 10 & 0x1fU) + (int)local_1c;
  local_29 = 0x1f < (local_28 | local_24 | local_20);
  if (local_29) {
    local_28 = math::clamp<int>(local_28,0,0x1f);
    local_24 = math::clamp<int>(local_24,0,0x1f);
    local_20 = math::clamp<int>(local_20,0,0x1f);
  }
  local_29 = !local_29;
  if ((in_CL & 1) != 0) {
    local_20 = local_20 << 3 | (int)local_20 >> 2;
    local_24 = local_24 << 3 | (int)local_24 >> 2;
    local_28 = local_28 << 3 | (int)local_28 >> 2;
  }
  alpha_00 = math::minimum<unsigned_int>(in_R8D,0xff);
  color_quad<unsigned_char,_int>::set_noclamp_rgba(in_RDI,local_28,local_24,local_20,alpha_00);
  return local_29;
}

Assistant:

bool etc1_block::unpack_color5(color_quad_u8& result, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha) {
  color_quad_i16 dc(unpack_delta3(packed_delta3));

  int b = (packed_color5 & 31U) + dc.b;
  int g = ((packed_color5 >> 5U) & 31U) + dc.g;
  int r = ((packed_color5 >> 10U) & 31U) + dc.r;

  bool success = true;
  if (static_cast<uint>(r | g | b) > 31U) {
    success = false;
    r = math::clamp<int>(r, 0, 31);
    g = math::clamp<int>(g, 0, 31);
    b = math::clamp<int>(b, 0, 31);
  }

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 3U) | (g >> 2U);
    r = (r << 3U) | (r >> 2U);
  }

  result.set_noclamp_rgba(r, g, b, math::minimum(alpha, 255U));
  return success;
}